

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Terminal.c
# Opt level: O0

int kwsysTerminalStreamIsVT100(FILE *stream,int default_vt100,int default_tty)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char *term;
  char **t;
  char *emacs;
  char *clicolor_force;
  int default_tty_local;
  int default_vt100_local;
  FILE *stream_local;
  
  pcVar2 = getenv("CLICOLOR_FORCE");
  if (((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) || (iVar1 = strcmp(pcVar2,"0"), iVar1 == 0)) {
    pcVar2 = getenv("EMACS");
    if ((pcVar2 == (char *)0x0) || (*pcVar2 != 't')) {
      if (default_vt100 == 0) {
        term = (char *)0x0;
        pcVar2 = getenv("TERM");
        if (pcVar2 != (char *)0x0) {
          term = (char *)kwsysTerminalVT100Names;
          while( true ) {
            bVar3 = false;
            if (*(long *)term != 0) {
              iVar1 = strcmp(pcVar2,*(char **)term);
              bVar3 = iVar1 != 0;
            }
            if (!bVar3) break;
            term = term + 8;
          }
        }
        if ((term == (char *)0x0) || (*(long *)term == 0)) {
          return 0;
        }
      }
      iVar1 = fileno((FILE *)stream);
      iVar1 = isatty(iVar1);
      stream_local._4_4_ = (uint)(iVar1 != 0);
    }
    else {
      stream_local._4_4_ = 0;
    }
  }
  else {
    stream_local._4_4_ = 1;
  }
  return stream_local._4_4_;
}

Assistant:

static int kwsysTerminalStreamIsVT100(FILE* stream, int default_vt100,
                                      int default_tty)
{
  /* Force color according to http://bixense.com/clicolors/ convention.  */
  {
    const char* clicolor_force = getenv("CLICOLOR_FORCE");
    if (clicolor_force && *clicolor_force &&
        strcmp(clicolor_force, "0") != 0) {
      return 1;
    }
  }

  /* If running inside emacs the terminal is not VT100.  Some emacs
     seem to claim the TERM is xterm even though they do not support
     VT100 escapes.  */
  {
    const char* emacs = getenv("EMACS");
    if (emacs && *emacs == 't') {
      return 0;
    }
  }

  /* Check for a valid terminal.  */
  if (!default_vt100) {
    const char** t = 0;
    const char* term = getenv("TERM");
    if (term) {
      for (t = kwsysTerminalVT100Names; *t && strcmp(term, *t) != 0; ++t) {
      }
    }
    if (!(t && *t)) {
      return 0;
    }
  }

#if defined(KWSYS_TERMINAL_ISATTY_WORKS)
  /* Make sure the stream is a tty. */
  (void)default_tty;
  return isatty(fileno(stream)) ? 1 : 0;
#else
  /* Check for cases in which the stream is definitely not a tty.  */
  if (kwsysTerminalStreamIsNotInteractive(stream)) {
    return 0;
  }

  /* Use the provided default for whether this is a tty.  */
  return default_tty;
#endif
}